

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

Reference<std::allocator<absl::cord_internal::CordRep_*>_> __thiscall
absl::inlined_vector_internal::
Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
EmplaceBack<absl::cord_internal::CordRep*const&>
          (Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  CordRep **ppCVar1;
  ulong uVar2;
  ulong uVar3;
  Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>> *pSVar4;
  size_type __n;
  CordRep **ppCStack_48;
  size_type sStack_40;
  CordRep **ppCStack_38;
  
  uVar2 = *(ulong *)this;
  uVar3 = 2;
  if ((uVar2 & 1) != 0) {
    uVar3 = *(ulong *)(this + 0x10);
  }
  if (uVar2 >> 1 == uVar3) {
    uVar2 = *(ulong *)this;
    pSVar4 = *(Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
               **)(this + 8);
    ppCStack_48 = (CordRep **)0x0;
    sStack_40 = 0;
    __n = 4;
    if ((uVar2 & 1) != 0) {
      __n = *(long *)(this + 0x10) * 2;
    }
    ppCStack_38 = args;
    ppCVar1 = __gnu_cxx::new_allocator<absl::cord_internal::CordRep_*>::allocate
                        ((new_allocator<absl::cord_internal::CordRep_*> *)&ppCStack_48,__n,
                         (void *)0x0);
    uVar3 = uVar2 >> 1;
    ppCVar1[uVar3] = *ppCStack_38;
    if (1 < uVar2) {
      if ((uVar2 & 1) == 0) {
        pSVar4 = this + 8;
      }
      uVar2 = 0;
      do {
        ppCVar1[uVar2] = *(CordRep **)(pSVar4 + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    ppCStack_48 = ppCVar1;
    sStack_40 = __n;
    if (((byte)*this & 1) != 0) {
      operator_delete(*(void **)(this + 8),*(long *)(this + 0x10) << 3);
    }
    *(CordRep ***)(this + 8) = ppCStack_48;
    *(size_type *)(this + 0x10) = sStack_40;
    *(ulong *)this = (*(ulong *)this | 1) + 2;
    return ppCVar1 + uVar3;
  }
  if ((uVar2 & 1) == 0) {
    pSVar4 = this + 8;
  }
  else {
    pSVar4 = *(Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
               **)(this + 8);
  }
  *(ValueType<std::allocator<absl::cord_internal::CordRep_*>_> *)(pSVar4 + (uVar2 >> 1) * 8) = *args
  ;
  *(ulong *)this = uVar2 + 2;
  return (Reference<std::allocator<absl::cord_internal::CordRep_*>_>)(pSVar4 + (uVar2 >> 1) * 8);
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }